

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool Curl_conn_seems_dead(connectdata *conn,Curl_easy *data,curltime *pnow)

{
  int iVar1;
  time_t tVar2;
  curl_trc_feat *pcVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  _Bool _Var9;
  uint uVar10;
  size_t sVar11;
  int *piVar12;
  timediff_t tVar13;
  byte bVar14;
  char *fmt;
  curltime cVar15;
  curltime newer;
  curltime older;
  curltime older_00;
  _Bool input_pending;
  _Bool local_39;
  int local_38 [2];
  time_t local_30;
  
  sVar11 = Curl_llist_count(&conn->easyq);
  if (sVar11 != 0) {
    return false;
  }
  if (pnow == (curltime *)0x0) {
    cVar15 = Curl_now();
    pnow = (curltime *)&local_30;
    local_30 = cVar15.tv_sec;
    piVar12 = local_38;
    local_38[0] = cVar15.tv_usec;
  }
  else {
    piVar12 = &pnow->tv_usec;
  }
  tVar2 = pnow->tv_sec;
  iVar1 = *piVar12;
  uVar5 = (conn->lastused).tv_sec;
  uVar6 = (conn->lastused).tv_usec;
  older.tv_usec = uVar6;
  older.tv_sec = uVar5;
  cVar15.tv_usec = iVar1;
  cVar15.tv_sec = tVar2;
  cVar15._12_4_ = 0;
  older._12_4_ = 0;
  tVar13 = Curl_timediff(cVar15,older);
  if ((data->set).maxage_conn < tVar13 / 1000) {
    bVar14 = 1;
    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
       ((pcVar3 = (data->state).feat, pcVar3 != (curl_trc_feat *)0x0 && (pcVar3->log_level < 1))))
    goto LAB_0015ffce;
    fmt = "Too old connection (%ld seconds idle), disconnect it";
  }
  else {
    uVar7 = (conn->created).tv_sec;
    uVar8 = (conn->created).tv_usec;
    older_00.tv_usec = uVar8;
    older_00.tv_sec = uVar7;
    newer.tv_usec = iVar1;
    newer.tv_sec = tVar2;
    newer._12_4_ = 0;
    older_00._12_4_ = 0;
    tVar13 = Curl_timediff(newer,older_00);
    lVar4 = (data->set).maxlifetime_conn;
    if ((lVar4 == 0) || (tVar13 / 1000 <= lVar4)) {
      if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
        local_39 = false;
        Curl_attach_connection(data,conn);
        _Var9 = Curl_conn_is_alive(data,conn,&local_39);
        bVar14 = !_Var9 | local_39;
      }
      else {
        Curl_attach_connection(data,conn);
        uVar10 = (*conn->handler->connection_check)(data,conn,1);
        bVar14 = (byte)uVar10;
      }
      Curl_detach_connection(data);
      goto LAB_0015ffce;
    }
    bVar14 = 1;
    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
       ((pcVar3 = (data->state).feat, pcVar3 != (curl_trc_feat *)0x0 && (pcVar3->log_level < 1))))
    goto LAB_0015ffce;
    fmt = "Too old connection (%ld seconds since creation), disconnect it";
  }
  bVar14 = 1;
  Curl_infof(data,fmt);
LAB_0015ffce:
  if ((((data != (Curl_easy *)0x0) && ((bVar14 & 1) != 0)) &&
      (((data->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
    Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
  }
  if ((bVar14 & 1) == 0) {
    return false;
  }
  return true;
}

Assistant:

bool Curl_conn_seems_dead(struct connectdata *conn,
                          struct Curl_easy *data,
                          struct curltime *pnow)
{
  DEBUGASSERT(!data->conn);
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection is not in
       use */
    bool dead;
    struct curltime now;
    if(!pnow) {
      now = Curl_now();
      pnow = &now;
    }

    if(conn_maxage(data, conn, *pnow)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      bool input_pending = FALSE;

      Curl_attach_connection(data, conn);
      dead = !Curl_conn_is_alive(data, conn, &input_pending);
      if(input_pending) {
        /* For reuse, we want a "clean" connection state. The includes
         * that we expect - in general - no waiting input data. Input
         * waiting might be a TLS Notify Close, for example. We reject
         * that.
         * For protocols where data from other end may arrive at
         * any time (HTTP/2 PING for example), the protocol handler needs
         * to install its own `connection_check` callback.
         */
        DEBUGF(infof(data, "connection has input pending, not reusable"));
        dead = TRUE;
      }
      Curl_detach_connection(data);
    }

    if(dead) {
      /* remove connection from cpool */
      infof(data, "Connection %" FMT_OFF_T " seems to be dead",
            conn->connection_id);
      return TRUE;
    }
  }
  return FALSE;
}